

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QFont>>::
emplace<QStyleSheetStyleCaches::Tampered<QFont>const&>
          (QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *this,QWidget **key,
          Tampered<QFont> *args)

{
  long lVar1;
  bool bVar2;
  QWidget **in_RSI;
  QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *in_RDI;
  long in_FS_OFFSET;
  QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> copy;
  Tampered<QFont> *in_stack_ffffffffffffff88;
  Tampered<QFont> *in_stack_ffffffffffffff90;
  Tampered<QFont> *in_stack_ffffffffffffff98;
  QWidget **in_stack_ffffffffffffffa0;
  piter local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::isDetached
                    ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)
                     in_stack_ffffffffffffff90);
  if (bVar2) {
    bVar2 = QHashPrivate::
            Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>_>::
            shouldGrow(in_RDI->d);
    if (bVar2) {
      QStyleSheetStyleCaches::Tampered<QFont>::Tampered
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_38 = (piter)emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>>
                                  (in_RDI,in_RSI,in_stack_ffffffffffffff98);
      QStyleSheetStyleCaches::Tampered<QFont>::~Tampered((Tampered<QFont> *)0x47f09e);
    }
    else {
      local_38 = (piter)emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>const&>
                                  (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::QHash
              ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)
               in_stack_ffffffffffffff90,
               (QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)
               in_stack_ffffffffffffff88);
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::detach
              ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)
               in_stack_ffffffffffffff90);
    local_38 = (piter)emplace_helper<QStyleSheetStyleCaches::Tampered<QFont>const&>
                                (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_>::~QHash
              ((QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QFont>_> *)
               in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_38;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }